

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

uint64_t __thiscall rcg::Buffer::getTimestampNS(Buffer *this)

{
  GC_ERROR GVar1;
  void *pvVar2;
  uint64_t uVar3;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  Device *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  size_t local_20;
  INFO_DATATYPE local_14;
  
  pvVar2 = Stream::getHandle(this->parent);
  local_30 = (Device *)0x0;
  local_20 = 8;
  if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar2 != (void *)0x0) {
    GVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DSGetBufferInfo)(pvVar2,this->buffer,0x1c,&local_14,&local_30,&local_20);
    if (GVar1 != 0) {
      local_30 = (Device *)0x0;
    }
  }
  if (local_30 == (Device *)0x0) {
    Stream::getParent(this->parent);
    uVar3 = Device::getTimestampFrequency(local_30);
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    pvVar2 = Stream::getHandle(this->parent);
    local_30 = (Device *)0x0;
    local_20 = 8;
    if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar2 != (void *)0x0) {
      GVar1 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                DSGetBufferInfo)(pvVar2,this->buffer,3,&local_14,&local_30,&local_20);
      if (GVar1 != 0) {
        local_30 = (Device *)0x0;
      }
    }
    if ((uVar3 != 0) && (uVar3 != 1000000000)) {
      local_30 = (Device *)
                 ((((ulong)local_30 % uVar3) * 1000000000) / uVar3 +
                 ((ulong)local_30 / uVar3) * 1000000000);
    }
  }
  return (uint64_t)local_30;
}

Assistant:

uint64_t Buffer::getTimestampNS() const
{
  uint64_t ret=getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                        GenTL::BUFFER_INFO_TIMESTAMP_NS);

  // if timestamp in nano seconds is not available, then compute it from
  // timestamp and device frequency

  if (ret == 0)
  {
    const uint64_t ns_freq=1000000000ul;
    uint64_t freq=parent->getParent()->getTimestampFrequency();

    if (freq == 0)
    {
      freq=ns_freq;
    }

    ret=getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                 GenTL::BUFFER_INFO_TIMESTAMP);

    if (freq != ns_freq)
    {
      ret=ret/freq*ns_freq+(ns_freq*(ret%freq))/freq;
    }
  }

  return ret;
}